

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  FILE *__stream;
  size_t sVar7;
  long lVar8;
  long lVar9;
  wasm_table_t *table;
  wasm_func_t *func;
  wasm_func_t *pwVar10;
  wasm_func_t *pwVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char *__s;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_limits_t limits;
  wasm_valtype_t *rs [1];
  wasm_valtype_t *ps [1];
  wasm_extern_vec_t imports;
  wasm_valtype_vec_t results;
  
  puts("Initializing...");
  uVar5 = wasm_engine_new();
  uVar6 = wasm_store_new(uVar5);
  puts("Loading binary...");
  __stream = fopen("table.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar7 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar7);
    sVar7 = fread(binary.data,sVar7,1,__stream);
    if (sVar7 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar8 = wasm_module_new(uVar6,&binary);
      if (lVar8 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Instantiating module...");
        imports.size = 0;
        imports.data = (wasm_extern_t **)0x0;
        lVar9 = wasm_instance_new(uVar6,lVar8,&imports,0);
        if (lVar9 != 0) {
          puts("Extracting exports...");
          wasm_instance_exports(lVar9);
          table = get_export_table(&exports,0);
          func = get_export_func(&exports,1);
          pwVar10 = get_export_func(&exports,2);
          pwVar11 = get_export_func(&exports,3);
          wasm_module_delete(lVar8);
          puts("Creating callback...");
          wasm_valtype_new_i32();
          rs[0] = wasm_valtype_new_i32();
          wasm_valtype_vec_new(&limits,1);
          wasm_valtype_vec_new(&results,1,rs);
          uVar12 = wasm_functype_new(&limits,&results);
          uVar13 = wasm_func_new(uVar6,uVar12,neg_callback);
          wasm_functype_delete(uVar12);
          uVar12 = wasm_table_copy(table);
          cVar1 = wasm_table_same(table);
          if (cVar1 != '\0') {
            wasm_table_delete(uVar12);
            puts("Checking table...");
            iVar4 = wasm_table_size(table);
            check(iVar4 == 2);
            check_table(table,0,false);
            check_table(table,1,true);
            check_trap(func,0,0);
            check_call(func,7,1,7);
            check_trap(func,0,2);
            puts("Mutating table...");
            uVar12 = wasm_func_as_ref(pwVar11);
            _Var2 = (_Bool)wasm_table_set(table,0,uVar12);
            check(_Var2);
            _Var2 = (_Bool)wasm_table_set(table,1,0);
            check(_Var2);
            uVar12 = wasm_func_as_ref(pwVar10);
            bVar3 = wasm_table_set(table,2,uVar12);
            check((_Bool)(bVar3 ^ 1));
            check_table(table,0,true);
            check_table(table,1,false);
            check_call(func,7,0,0x29a);
            check_trap(func,0,1);
            check_trap(func,0,2);
            puts("Growing table...");
            _Var2 = (_Bool)wasm_table_grow(table,3,0);
            check(_Var2);
            iVar4 = wasm_table_size(table);
            check(iVar4 == 5);
            uVar12 = wasm_func_as_ref(pwVar10);
            _Var2 = (_Bool)wasm_table_set(table,2,uVar12);
            check(_Var2);
            uVar12 = wasm_func_as_ref(uVar13);
            _Var2 = (_Bool)wasm_table_set(table,3,uVar12);
            check(_Var2);
            bVar3 = wasm_table_set(table,5,0);
            check((_Bool)(bVar3 ^ 1));
            check_table(table,2,true);
            check_table(table,3,true);
            check_table(table,4,false);
            check_call(func,5,2,5);
            check_call(func,6,3,-6);
            check_trap(func,0,4);
            check_trap(func,0,5);
            uVar12 = wasm_func_as_ref(pwVar10);
            _Var2 = (_Bool)wasm_table_grow(table,2,uVar12);
            check(_Var2);
            iVar4 = wasm_table_size(table);
            check(iVar4 == 7);
            check_table(table,5,true);
            check_table(table,6,true);
            bVar3 = wasm_table_grow(table,5,0);
            check((_Bool)(bVar3 ^ 1));
            _Var2 = (_Bool)wasm_table_grow(table,3,0);
            check(_Var2);
            _Var2 = (_Bool)wasm_table_grow(table,0,0);
            check(_Var2);
            wasm_func_delete(uVar13);
            wasm_extern_vec_delete(&exports);
            wasm_instance_delete(lVar9);
            puts("Creating stand-alone table...");
            limits.min = 5;
            limits.max = 5;
            uVar12 = wasm_valtype_new(0x81);
            uVar12 = wasm_tabletype_new(uVar12,&limits);
            uVar13 = wasm_table_new(uVar6,uVar12,0);
            iVar4 = wasm_table_size(uVar13);
            check(iVar4 == 5);
            bVar3 = wasm_table_grow(uVar13,1,0);
            check((_Bool)(bVar3 ^ 1));
            _Var2 = (_Bool)wasm_table_grow(uVar13,0,0);
            check(_Var2);
            wasm_tabletype_delete(uVar12);
            wasm_table_delete(uVar13);
            puts("Shutting down...");
            wasm_store_delete(uVar6);
            wasm_engine_delete(uVar5);
            puts("Done.");
            return 0;
          }
          __assert_fail("wasm_table_same(table, copy)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/table.c"
                        ,0x8d,"int main(int, const char **)");
        }
        __s = "> Error instantiating module!";
      }
      goto LAB_00102b98;
    }
  }
  __s = "> Error loading module!";
LAB_00102b98:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("table.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_table_t* table = get_export_table(&exports, i++);
  wasm_func_t* call_indirect = get_export_func(&exports, i++);
  wasm_func_t* f = get_export_func(&exports, i++);
  wasm_func_t* g = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Create external function.
  printf("Creating callback...\n");
  own wasm_functype_t* neg_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* h = wasm_func_new(store, neg_type, neg_callback);

  wasm_functype_delete(neg_type);

  // Try cloning.
  own wasm_table_t* copy = wasm_table_copy(table);
  assert(wasm_table_same(table, copy));
  wasm_table_delete(copy);

  // Check initial table.
  printf("Checking table...\n");
  check(wasm_table_size(table) == 2);
  check_table(table, 0, false);
  check_table(table, 1, true);
  check_trap(call_indirect, 0, 0);
  check_call(call_indirect, 7, 1, 7);
  check_trap(call_indirect, 0, 2);

  // Mutate table.
  printf("Mutating table...\n");
  check(wasm_table_set(table, 0, wasm_func_as_ref(g)));
  check(wasm_table_set(table, 1, NULL));
  check(! wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check_table(table, 0, true);
  check_table(table, 1, false);
  check_call(call_indirect, 7, 0, 666);
  check_trap(call_indirect, 0, 1);
  check_trap(call_indirect, 0, 2);

  // Grow table.
  printf("Growing table...\n");
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_size(table) == 5);
  check(wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_set(table, 3, wasm_func_as_ref(h)));
  check(! wasm_table_set(table, 5, NULL));
  check_table(table, 2, true);
  check_table(table, 3, true);
  check_table(table, 4, false);
  check_call(call_indirect, 5, 2, 5);
  check_call(call_indirect, 6, 3, -6);
  check_trap(call_indirect, 0, 4);
  check_trap(call_indirect, 0, 5);

  check(wasm_table_grow(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_size(table) == 7);
  check_table(table, 5, true);
  check_table(table, 6, true);

  check(! wasm_table_grow(table, 5, NULL));
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_grow(table, 0, NULL));

  wasm_func_delete(h);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone table.
  // TODO(wasm+): Once Wasm allows multiple tables, turn this into import.
  printf("Creating stand-alone table...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_tabletype_t* tabletype =
    wasm_tabletype_new(wasm_valtype_new(WASM_FUNCREF), &limits);
  own wasm_table_t* table2 = wasm_table_new(store, tabletype, NULL);
  check(wasm_table_size(table2) == 5);
  check(! wasm_table_grow(table2, 1, NULL));
  check(wasm_table_grow(table2, 0, NULL));

  wasm_tabletype_delete(tabletype);
  wasm_table_delete(table2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}